

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double calc_kurtosis_weighted<double,long,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,long *Xc_ind,
                 long *Xc_indptr,MissingAction missing_action,
                 vector<double,_std::allocator<double>_> *w)

{
  ulong *puVar1;
  long lVar2;
  pointer pdVar3;
  bool bVar4;
  size_t sVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong *puVar14;
  double __z;
  double dVar15;
  double __z_00;
  double __z_01;
  double dVar16;
  double dVar17;
  double dVar18;
  double local_a0;
  
  lVar8 = Xc_indptr[col_num];
  lVar2 = Xc_indptr[col_num + 1];
  if (st <= end && lVar8 != lVar2) {
    dVar15 = 0.0;
    sVar5 = st;
    do {
      dVar15 = dVar15 + (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[ix_arr[sVar5]];
      sVar5 = sVar5 + 1;
    } while (sVar5 <= end);
    if (0.0 < dVar15) {
      puVar14 = ix_arr + st;
      puVar13 = ix_arr + end + 1;
      uVar6 = (long)puVar13 - (long)puVar14 >> 3;
      if (0 < (long)uVar6) {
        do {
          uVar9 = uVar6 >> 1;
          uVar12 = ~uVar9 + uVar6;
          uVar6 = uVar9;
          if (puVar14[uVar9] < (ulong)Xc_ind[lVar8]) {
            puVar14 = puVar14 + uVar9 + 1;
            uVar6 = uVar12;
          }
        } while (0 < (long)uVar6);
      }
      uVar6 = Xc_ind[lVar2 + -1];
      if (missing_action == Fail) {
        if (puVar14 == puVar13) {
          return -INFINITY;
        }
        pdVar3 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        __z = 0.0;
        __z_00 = 0.0;
        local_a0 = 0.0;
        __z_01 = 0.0;
        while (uVar9 = *puVar14, uVar9 <= uVar6) {
          puVar1 = (ulong *)(Xc_ind + lVar8);
          uVar12 = *puVar1;
          if (uVar12 == uVar9) {
            dVar17 = pdVar3[uVar9];
            dVar18 = Xc[lVar8];
            dVar16 = dVar18 * dVar18;
            __z = fma(dVar17,dVar18,__z);
            __z_00 = fma(dVar17,dVar16,__z_00);
            local_a0 = fma(dVar17,dVar18 * dVar16,local_a0);
            __z_01 = fma(dVar17,dVar16 * dVar16,__z_01);
            if ((puVar14 == ix_arr + end) || (lVar8 == lVar2 + -1)) break;
            puVar7 = puVar1 + 1;
            puVar14 = puVar14 + 1;
            uVar9 = (long)Xc_ind + (lVar2 * 8 - (long)puVar7) >> 3;
            if (0 < (long)uVar9) {
              do {
                uVar12 = uVar9 >> 1;
                uVar10 = ~uVar12 + uVar9;
                uVar9 = uVar12;
                if ((puVar7 + uVar12 + 1)[-1] < *puVar14) {
                  puVar7 = puVar7 + uVar12 + 1;
                  uVar9 = uVar10;
                }
              } while (0 < (long)uVar9);
            }
LAB_0012c4a4:
            lVar8 = (long)puVar7 - (long)Xc_ind >> 3;
          }
          else {
            if ((long)uVar12 <= (long)uVar9) {
              puVar7 = puVar1 + 1;
              uVar12 = (long)Xc_ind + (lVar2 * 8 - (long)(puVar1 + 1)) >> 3;
              while (0 < (long)uVar12) {
                uVar10 = uVar12 >> 1;
                uVar11 = ~uVar10 + uVar12;
                uVar12 = uVar10;
                if ((puVar7 + uVar10 + 1)[-1] < uVar9) {
                  puVar7 = puVar7 + uVar10 + 1;
                  uVar12 = uVar11;
                }
              }
              goto LAB_0012c4a4;
            }
            puVar14 = puVar14 + 1;
            uVar9 = (long)puVar13 - (long)puVar14 >> 3;
            while (0 < (long)uVar9) {
              uVar10 = uVar9 >> 1;
              uVar11 = ~uVar10 + uVar9;
              uVar9 = uVar10;
              if (puVar14[uVar10] < uVar12) {
                puVar14 = puVar14 + uVar10 + 1;
                uVar9 = uVar11;
              }
            }
          }
          if ((puVar14 == puVar13) || (lVar8 == lVar2)) break;
        }
      }
      else {
        if (puVar14 == puVar13) {
          __z_01 = 0.0;
          local_a0 = 0.0;
          __z_00 = 0.0;
          __z = 0.0;
        }
        else {
          pdVar3 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          __z = 0.0;
          __z_00 = 0.0;
          local_a0 = 0.0;
          __z_01 = 0.0;
          while (uVar9 = *puVar14, uVar9 <= uVar6) {
            puVar1 = (ulong *)(Xc_ind + lVar8);
            uVar12 = *puVar1;
            if (uVar12 == uVar9) {
              dVar17 = pdVar3[uVar9];
              dVar18 = Xc[lVar8];
              if ((ulong)ABS(dVar18) < 0x7ff0000000000000) {
                dVar16 = dVar18 * dVar18;
                __z = fma(dVar17,dVar18,__z);
                __z_00 = fma(dVar17,dVar16,__z_00);
                local_a0 = fma(dVar17,dVar18 * dVar16,local_a0);
                __z_01 = fma(dVar17,dVar16 * dVar16,__z_01);
              }
              else {
                dVar15 = dVar15 - dVar17;
              }
              if ((puVar14 == ix_arr + end) || (lVar8 == lVar2 + -1)) break;
              puVar7 = puVar1 + 1;
              puVar14 = puVar14 + 1;
              uVar9 = (long)Xc_ind + (lVar2 * 8 - (long)puVar7) >> 3;
              if (0 < (long)uVar9) {
                do {
                  uVar12 = uVar9 >> 1;
                  uVar10 = ~uVar12 + uVar9;
                  uVar9 = uVar12;
                  if ((puVar7 + uVar12 + 1)[-1] < *puVar14) {
                    puVar7 = puVar7 + uVar12 + 1;
                    uVar9 = uVar10;
                  }
                } while (0 < (long)uVar9);
              }
LAB_0012c257:
              lVar8 = (long)puVar7 - (long)Xc_ind >> 3;
            }
            else {
              if ((long)uVar12 <= (long)uVar9) {
                puVar7 = puVar1 + 1;
                uVar12 = (long)Xc_ind + (lVar2 * 8 - (long)(puVar1 + 1)) >> 3;
                while (0 < (long)uVar12) {
                  uVar10 = uVar12 >> 1;
                  uVar11 = ~uVar10 + uVar12;
                  uVar12 = uVar10;
                  if ((puVar7 + uVar10 + 1)[-1] < uVar9) {
                    puVar7 = puVar7 + uVar10 + 1;
                    uVar12 = uVar11;
                  }
                }
                goto LAB_0012c257;
              }
              puVar14 = puVar14 + 1;
              uVar9 = (long)puVar13 - (long)puVar14 >> 3;
              while (0 < (long)uVar9) {
                uVar10 = uVar9 >> 1;
                uVar11 = ~uVar10 + uVar9;
                uVar9 = uVar10;
                if (puVar14[uVar10] < uVar12) {
                  puVar14 = puVar14 + uVar10 + 1;
                  uVar9 = uVar11;
                }
              }
            }
            if ((puVar14 == puVar13) || (lVar8 == lVar2)) break;
          }
        }
        if (dVar15 <= 0.0) {
          return -INFINITY;
        }
      }
      if ((1.0 < dVar15) && ((__z_00 != 0.0 || (NAN(__z_00))))) {
        if ((__z_00 != __z * __z) || (NAN(__z_00) || NAN(__z * __z))) {
          dVar16 = __z / dVar15;
          dVar17 = dVar16 * dVar16;
          dVar18 = __z_00 / dVar15 - dVar17;
          if ((!NAN(dVar18)) &&
             ((2.220446049250313e-16 < dVar18 ||
              (bVar4 = check_more_than_two_unique_values<double,long>
                                 (ix_arr,st,end,col_num,Xc_indptr,Xc_ind,Xc,missing_action), bVar4))
             )) {
            if (dVar18 <= 0.0) {
              return 0.0;
            }
            dVar15 = (dVar17 * dVar16 * dVar16 * dVar15 +
                     __z * -4.0 * dVar17 * dVar16 +
                     __z_00 * 6.0 * dVar17 + local_a0 * -4.0 * dVar16 + __z_01) /
                     (dVar18 * dVar18 * dVar15);
            if ((long)ABS(dVar15) < 0x7ff0000000000000) {
              if (dVar15 <= 0.0) {
                return 0.0;
              }
              return dVar15;
            }
            return -INFINITY;
          }
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}